

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

_GLFWmapping * findValidMapping(_GLFWjoystick *js)

{
  GLFWbool GVar1;
  _GLFWmapping *p_Var2;
  long lVar3;
  char *format;
  
  p_Var2 = findMapping(js->guid);
  if (p_Var2 == (_GLFWmapping *)0x0) {
    return (_GLFWmapping *)0x0;
  }
  format = "Invalid button in gamepad mapping %s (%s)";
  lVar3 = 0xa1;
  while (lVar3 + 4 != 0xe1) {
    GVar1 = isValidElementForJoystick((_GLFWmapelement *)(p_Var2->name + lVar3),js);
    lVar3 = lVar3 + 4;
    if (GVar1 == 0) goto LAB_00112a9d;
  }
  format = "Invalid axis in gamepad mapping %s (%s)";
  lVar3 = 0xdd;
  do {
    if (lVar3 + 4 == 0xf9) {
      return p_Var2;
    }
    GVar1 = isValidElementForJoystick((_GLFWmapelement *)(p_Var2->name + lVar3),js);
    lVar3 = lVar3 + 4;
  } while (GVar1 != 0);
LAB_00112a9d:
  _glfwInputError(0x10004,format,p_Var2->guid,p_Var2);
  return (_GLFWmapping *)0x0;
}

Assistant:

static _GLFWmapping* findValidMapping(const _GLFWjoystick* js)
{
    _GLFWmapping* mapping = findMapping(js->guid);
    if (mapping)
    {
        int i;

        for (i = 0;  i <= GLFW_GAMEPAD_BUTTON_LAST;  i++)
        {
            if (!isValidElementForJoystick(mapping->buttons + i, js))
            {
                _glfwInputError(GLFW_INVALID_VALUE,
                                "Invalid button in gamepad mapping %s (%s)",
                                mapping->guid,
                                mapping->name);
                return NULL;
            }
        }

        for (i = 0;  i <= GLFW_GAMEPAD_AXIS_LAST;  i++)
        {
            if (!isValidElementForJoystick(mapping->axes + i, js))
            {
                _glfwInputError(GLFW_INVALID_VALUE,
                                "Invalid axis in gamepad mapping %s (%s)",
                                mapping->guid,
                                mapping->name);
                return NULL;
            }
        }
    }

    return mapping;
}